

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::csharp::TryRemovePrefix
                   (string *__return_storage_ptr__,string *prefix,string *value)

{
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  pointer pcVar4;
  char cVar5;
  ulong uVar6;
  size_type *local_50;
  string prefix_to_match;
  
  local_50 = &prefix_to_match._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  uVar2 = prefix->_M_string_length;
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      if ((prefix->_M_dataplus)._M_p[uVar6] != '_') {
        std::__cxx11::string::push_back((char)&local_50);
        uVar2 = prefix->_M_string_length;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar2);
  }
  uVar2 = value->_M_string_length;
  if (prefix_to_match._M_dataplus._M_p == (pointer)0x0) {
    uVar6 = 0;
  }
  else {
    pcVar3 = (value->_M_dataplus)._M_p;
    uVar6 = 0;
    pcVar4 = (pointer)0x0;
    do {
      if (uVar2 == uVar6) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        goto LAB_001f938a;
      }
      cVar1 = pcVar3[uVar6];
      if (cVar1 != '_') {
        cVar5 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar5 = cVar1;
        }
        if (cVar5 != *(char *)((long)local_50 + (long)pcVar4)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar3,pcVar3 + uVar2);
          goto LAB_001f93c0;
        }
        pcVar4 = pcVar4 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (pcVar4 < prefix_to_match._M_dataplus._M_p);
  }
  if (uVar6 < uVar2) {
    do {
      if ((value->_M_dataplus)._M_p[uVar6] != '_') goto LAB_001f9372;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  else {
LAB_001f9372:
    if (uVar6 != uVar2) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)value);
      goto LAB_001f93c0;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (value->_M_dataplus)._M_p;
LAB_001f938a:
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar3,pcVar3 + uVar2);
LAB_001f93c0:
  if (local_50 != &prefix_to_match._M_string_length) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TryRemovePrefix(const std::string& prefix, const std::string& value) {
  // First normalize to a lower-case no-underscores prefix to match against
  std::string prefix_to_match = "";
  for (size_t i = 0; i < prefix.size(); i++) {
    if (prefix[i] != '_') {
      prefix_to_match += ascii_tolower(prefix[i]);
    }
  }

  // This keeps track of how much of value we've consumed
  size_t prefix_index, value_index;
  for (prefix_index = 0, value_index = 0;
      prefix_index < prefix_to_match.size() && value_index < value.size();
      value_index++) {
    // Skip over underscores in the value
    if (value[value_index] == '_') {
      continue;
    }
    if (ascii_tolower(value[value_index]) != prefix_to_match[prefix_index++]) {
      // Failed to match the prefix - bail out early.
      return value;
    }
  }

  // If we didn't finish looking through the prefix, we can't strip it.
  if (prefix_index < prefix_to_match.size()) {
    return value;
  }

  // Step over any underscores after the prefix
  while (value_index < value.size() && value[value_index] == '_') {
    value_index++;
  }

  // If there's nothing left (e.g. it was a prefix with only underscores afterwards), don't strip.
  if (value_index == value.size()) {
    return value;
  }

  return value.substr(value_index);
}